

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.h
# Opt level: O3

void __thiscall
wabt::TypeChecker::PrintStackIfFailed<wabt::Type,wabt::Type,wabt::Type>
          (TypeChecker *this,Result result,char *desc,Type args,Type args_1,Type args_2)

{
  initializer_list<wabt::Type> __l;
  Type local_4c;
  Type local_48;
  Type local_44;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_40;
  allocator_type local_21;
  
  if (result.enum_ == Error) {
    __l._M_len = 3;
    __l._M_array = &local_4c;
    local_4c = args;
    local_48 = args_1;
    local_44 = args_2;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_40,__l,&local_21);
    PrintStackIfFailed(this,(Result)0x1,desc,&local_40);
    if (local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void PrintStackIfFailed(Result result, const char* desc, Args... args) {
    // Minor optimzation, check result before constructing the vector to pass
    // to the other overload of PrintStackIfFailed.
    if (Failed(result)) {
      PrintStackIfFailed(result, desc, {args...});
    }
  }